

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringCacheTest.cpp
# Opt level: O1

void __thiscall
TEST_SimpleStringInternalCache_clearAllIncludingCurrentlyUsedMemoryAlsoReleasesLargeNonCachesMemory_Test
::
TEST_SimpleStringInternalCache_clearAllIncludingCurrentlyUsedMemoryAlsoReleasesLargeNonCachesMemory_Test
          (TEST_SimpleStringInternalCache_clearAllIncludingCurrentlyUsedMemoryAlsoReleasesLargeNonCachesMemory_Test
           *this)

{
  memset(this,0,0xa0);
  Utest::Utest((Utest *)this);
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupSimpleStringInternalCache_00370b30;
  SimpleStringInternalCache::SimpleStringInternalCache
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).cache);
  MemoryAccountant::MemoryAccountant
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).accountant);
  ExecFunction::ExecFunction
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).testFunction.
              super_ExecFunction);
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).testFunction.super_ExecFunction.
  _vptr_ExecFunction = (_func_int **)&PTR__ExecFunctionWithoutParameters_00370b70;
  TestTestingFixture::TestTestingFixture
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).fixture);
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupSimpleStringInternalCache_00370658;
  return;
}

Assistant:

TEST(SimpleStringInternalCache, clearAllIncludingCurrentlyUsedMemoryAlsoReleasesLargeNonCachesMemory)
{
    cache.setAllocator(allocator);

    cache.alloc(1234);
    cache.alloc(1234);
    cache.alloc(1234);

    cache.clearAllIncludingCurrentlyUsedMemory();

    LONGS_EQUAL(3, accountant.totalAllocationsOfSize(1234));
    LONGS_EQUAL(3, accountant.totalDeallocationsOfSize(1234));
}